

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_as_json_dbpointer(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  bson_oid_t oid;
  size_t len;
  
  bson_oid_init_from_string(&oid,"12341234123412abcdababcd");
  uVar3 = bson_new();
  cVar1 = bson_append_dbpointer(uVar3,"dbpointer",0xffffffffffffffff,"collection",&oid);
  if (cVar1 == '\0') {
    pcVar4 = "bson_append_dbpointer (b, \"dbpointer\", -1, \"collection\", &oid)";
    uVar3 = 0x265;
  }
  else {
    cVar1 = bson_append_dbpointer(uVar3,"escaping",0xffffffffffffffff,"\"coll\"",&oid);
    if (cVar1 != '\0') {
      pcVar4 = (char *)bson_as_json(uVar3,&len);
      if (pcVar4 != 
          "{ \"dbpointer\" : { \"$ref\" : \"collection\", \"$id\" : \"12341234123412abcdababcd\" }, \"escaping\" : { \"$ref\" : \"\\\"coll\\\"\", \"$id\" : \"12341234123412abcdababcd\" } }"
         ) {
        iVar2 = strcmp(pcVar4,
                       "{ \"dbpointer\" : { \"$ref\" : \"collection\", \"$id\" : \"12341234123412abcdababcd\" }, \"escaping\" : { \"$ref\" : \"\\\"coll\\\"\", \"$id\" : \"12341234123412abcdababcd\" } }"
                      );
        if (iVar2 != 0) {
          fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",pcVar4,
                  "{ \"dbpointer\" : { \"$ref\" : \"collection\", \"$id\" : \"12341234123412abcdababcd\" }, \"escaping\" : { \"$ref\" : \"\\\"coll\\\"\", \"$id\" : \"12341234123412abcdababcd\" } }"
                 );
          abort();
        }
      }
      bson_free(pcVar4);
      bson_destroy(uVar3);
      return;
    }
    pcVar4 = "bson_append_dbpointer (b, \"escaping\", -1, \"\\\"coll\\\"\", &oid)";
    uVar3 = 0x266;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar3,"test_bson_as_json_dbpointer",pcVar4);
  abort();
}

Assistant:

static void
test_bson_as_json_dbpointer (void)
{
   bson_oid_t oid;
   bson_t *b;
   char *str;
   size_t len;

   bson_oid_init_from_string (&oid, "12341234123412abcdababcd");

   b = bson_new ();
   BSON_ASSERT (bson_append_dbpointer (b, "dbpointer", -1, "collection", &oid));
   BSON_ASSERT (bson_append_dbpointer (b, "escaping", -1, "\"coll\"", &oid));
   str = bson_as_json (b, &len);

   ASSERT_CMPSTR (str,
                  "{"
                  " \"dbpointer\" : { \"$ref\" : \"collection\", \"$id\" "
                  ": \"12341234123412abcdababcd\" },"
                  " \"escaping\" : { \"$ref\" : \"\\\"coll\\\"\", \"$id\" "
                  ": \"12341234123412abcdababcd\" } }");

   bson_free (str);
   bson_destroy (b);
}